

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterRender.cpp
# Opt level: O0

void * FilterRender::doSlice
                 (void *data,uint width,uint height,
                 vector<Geometry::Point,_std::allocator<Geometry::Point>_> *poly)

{
  code *pcVar1;
  bool bVar2;
  ulong uVar3;
  void *pvVar4;
  uint local_9c;
  uint local_98;
  int j_4;
  int i_4;
  int k_2;
  int j_3;
  int i_3;
  int k_1;
  vector<Geometry::Point,_std::allocator<Geometry::Point>_> local_78;
  Point local_60;
  uint local_4c;
  uint local_48;
  int j_2;
  int i_2;
  int k;
  int j_1;
  int i_1;
  uchar *p;
  int j;
  int i;
  uchar ***map;
  vector<Geometry::Point,_std::allocator<Geometry::Point>_> *poly_local;
  uint height_local;
  uint width_local;
  void *data_local;
  
  uVar3 = SUB168(ZEXT416(height) * ZEXT816(8),0);
  if (SUB168(ZEXT416(height) * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  map = (uchar ***)poly;
  poly_local._0_4_ = height;
  poly_local._4_4_ = width;
  _height_local = data;
  _j = operator_new__(uVar3);
  for (p._4_4_ = 0; p._4_4_ < (uint)poly_local; p._4_4_ = p._4_4_ + 1) {
    uVar3 = SUB168(ZEXT416(poly_local._4_4_) * ZEXT816(8),0);
    if (SUB168(ZEXT416(poly_local._4_4_) * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    *(void **)((long)_j + (long)(int)p._4_4_ * 8) = pvVar4;
    for (p._0_4_ = 0; (uint)p < poly_local._4_4_; p._0_4_ = (uint)p + 1) {
      pvVar4 = operator_new__(4);
      *(void **)(*(long *)((long)_j + (long)(int)p._4_4_ * 8) + (long)(int)(uint)p * 8) = pvVar4;
    }
  }
  _j_1 = _height_local;
  for (k = 0; (uint)k < (uint)poly_local; k = k + 1) {
    for (i_2 = 0; (uint)i_2 < poly_local._4_4_; i_2 = i_2 + 1) {
      for (j_2 = 0; j_2 < 4; j_2 = j_2 + 1) {
        *(undefined1 *)(*(long *)(*(long *)((long)_j + (long)k * 8) + (long)i_2 * 8) + (long)j_2) =
             *(undefined1 *)((long)_j_1 + (long)j_2);
      }
      _j_1 = (void *)((long)_j_1 + 4);
    }
  }
  for (local_48 = 0; local_48 < (uint)poly_local; local_48 = local_48 + 1) {
    for (local_4c = 0; local_4c < poly_local._4_4_; local_4c = local_4c + 1) {
      Geometry::Point::Point(&local_60,(double)(int)local_48,(double)(int)local_4c);
      std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::vector(&local_78,poly);
      bVar2 = Geometry::InPoly(&local_60,&local_78);
      std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::~vector(&local_78);
      Geometry::Point::~Point(&local_60);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        for (j_3 = 0; j_3 < 4; j_3 = j_3 + 1) {
          *(undefined1 *)
           (*(long *)(*(long *)((long)_j + (long)(int)local_48 * 8) + (long)(int)local_4c * 8) +
           (long)j_3) = 0;
        }
      }
    }
  }
  _j_1 = _height_local;
  for (k_2 = 0; (uint)k_2 < (uint)poly_local; k_2 = k_2 + 1) {
    for (i_4 = 0; (uint)i_4 < poly_local._4_4_; i_4 = i_4 + 1) {
      for (j_4 = 0; j_4 < 4; j_4 = j_4 + 1) {
        *(undefined1 *)((long)_j_1 + (long)j_4) =
             *(undefined1 *)
              (*(long *)(*(long *)((long)_j + (long)k_2 * 8) + (long)i_4 * 8) + (long)j_4);
      }
      _j_1 = (void *)((long)_j_1 + 4);
    }
  }
  for (local_98 = 0; local_98 < (uint)poly_local; local_98 = local_98 + 1) {
    for (local_9c = 0; local_9c < poly_local._4_4_; local_9c = local_9c + 1) {
      pvVar4 = *(void **)(*(long *)((long)_j + (long)(int)local_98 * 8) + (long)(int)local_9c * 8);
      if (pvVar4 != (void *)0x0) {
        operator_delete__(pvVar4);
      }
    }
    pvVar4 = *(void **)((long)_j + (long)(int)local_98 * 8);
    if (pvVar4 != (void *)0x0) {
      operator_delete__(pvVar4);
    }
  }
  if (_j != (void *)0x0) {
    operator_delete__(_j);
  }
  _j = (void *)0x0;
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void* FilterRender::doSlice(void *data, uint width, uint height, std::vector<Point> poly) {
	unsigned char ***map;

	map = new unsigned char**[height];
	for (int i = 0; i < height; i++) {
		map[i] = new unsigned char*[width];
		for (int j = 0; j < width; j++) {
			map[i][j] = new unsigned char[4];
		}
	}

	unsigned char * p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = *(p + k);
				// b g r a
			}
			p += 4;
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			if (!InPoly(Point(i, j), poly)) {
				for (int k = 0; k < 4; k++) {
					map[i][j][k] = 0;
				}
			}
		}
	}

	p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				*(p + k) = map[i][j][k];
			}
			p += 4;
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			delete [] map[i][j];
		}
		delete [] map[i];
	}
	delete [] map;
	map = NULL;
}